

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int DLevelScript::ThingCount(int type,int stringid,int tid,int tag)

{
  bool bVar1;
  bool bVar2;
  char *name;
  AActor *pAVar3;
  PClassActor *pPVar4;
  PClassActor *newkind;
  TThinkerIterator<AActor> iterator_1;
  FActorIterator iterator;
  char *type_name;
  bool replacemented;
  PClassActor *pPStack_30;
  int count;
  PClassActor *kind;
  AActor *actor;
  int tag_local;
  int tid_local;
  int stringid_local;
  int type_local;
  
  type_name._4_4_ = 0;
  bVar1 = false;
  if (type < 1) {
    if (stringid < 0) {
      pPStack_30 = (PClassActor *)0x0;
    }
    else {
      name = FBehavior::StaticLookupString(stringid);
      if (name == (char *)0x0) {
        return 0;
      }
      pPStack_30 = PClass::FindActor(name);
      if (pPStack_30 == (PClassActor *)0x0) {
        return 0;
      }
    }
  }
  else {
    pPStack_30 = P_GetSpawnableType(type);
    if (pPStack_30 == (PClassActor *)0x0) {
      return 0;
    }
  }
  do {
    if (tid == 0) {
      TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&newkind,0x80);
      while (pAVar3 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&newkind,false),
            pAVar3 != (AActor *)0x0) {
        if ((((0 < pAVar3->health) &&
             ((pPStack_30 == (PClassActor *)0x0 ||
              (bVar2 = DObject::IsA((DObject *)pAVar3,&pPStack_30->super_PClass), bVar2)))) &&
            ((tag == -1 ||
             (bVar2 = FTagManager::SectorHasTag(&tagManager,pAVar3->Sector,tag), bVar2)))) &&
           ((bVar2 = DObject::IsKindOf((DObject *)pAVar3,AInventory::RegistrationInfo.MyClass),
            !bVar2 || (bVar2 = TObjPtr<AActor>::operator==
                                         ((TObjPtr<AActor> *)(pAVar3 + 1),(AActor *)0x0), bVar2))))
        {
          type_name._4_4_ = type_name._4_4_ + 1;
        }
      }
    }
    else {
      FActorIterator::FActorIterator
                ((FActorIterator *)&iterator_1.super_FThinkerIterator.m_Stat,tid);
      while (pAVar3 = FActorIterator::Next
                                ((FActorIterator *)&iterator_1.super_FThinkerIterator.m_Stat),
            pAVar3 != (AActor *)0x0) {
        if (((0 < pAVar3->health) &&
            ((pPStack_30 == (PClassActor *)0x0 ||
             (bVar2 = DObject::IsA((DObject *)pAVar3,&pPStack_30->super_PClass), bVar2)))) &&
           (((tag == -1 ||
             (bVar2 = FTagManager::SectorHasTag(&tagManager,pAVar3->Sector,tag), bVar2)) &&
            ((bVar2 = DObject::IsKindOf((DObject *)pAVar3,AInventory::RegistrationInfo.MyClass),
             !bVar2 || (bVar2 = TObjPtr<AActor>::operator==
                                          ((TObjPtr<AActor> *)(pAVar3 + 1),(AActor *)0x0), bVar2))))
           )) {
          type_name._4_4_ = type_name._4_4_ + 1;
        }
      }
    }
    if (bVar1) {
      return type_name._4_4_;
    }
    if (pPStack_30 == (PClassActor *)0x0) {
      return type_name._4_4_;
    }
    bVar1 = true;
    pPVar4 = PClassActor::GetReplacement(pPStack_30,true);
    bVar2 = pPVar4 != pPStack_30;
    pPStack_30 = pPVar4;
  } while (bVar2);
  return type_name._4_4_;
}

Assistant:

int DLevelScript::ThingCount (int type, int stringid, int tid, int tag)
{
	AActor *actor;
	PClassActor *kind;
	int count = 0;
	bool replacemented = false;

	if (type > 0)
	{
		kind = P_GetSpawnableType(type);
		if (kind == NULL)
			return 0;
	}
	else if (stringid >= 0)
	{
		const char *type_name = FBehavior::StaticLookupString (stringid);
		if (type_name == NULL)
			return 0;

		kind = PClass::FindActor(type_name);
		if (kind == NULL)
			return 0;
	}
	else
	{
		kind = NULL;
	}

do_count:
	if (tid)
	{
		FActorIterator iterator (tid);
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	else
	{
		TThinkerIterator<AActor> iterator;
		while ( (actor = iterator.Next ()) )
		{
			if (actor->health > 0 &&
				(kind == NULL || actor->IsA (kind)))
			{
				if (tag == -1 || tagManager.SectorHasTag(actor->Sector, tag))
				{
					// Don't count items in somebody's inventory
					if (!actor->IsKindOf (RUNTIME_CLASS(AInventory)) ||
						static_cast<AInventory *>(actor)->Owner == NULL)
					{
						count++;
					}
				}
			}
		}
	}
	if (!replacemented && kind != NULL)
	{
		// Again, with decorate replacements
		replacemented = true;
		PClassActor *newkind = kind->GetReplacement();
		if (newkind != kind)
		{
			kind = newkind;
			goto do_count;
		}
	}
	return count;
}